

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

id_type __thiscall Darts::Details::DawgBuilder::append_node(DawgBuilder *this)

{
  bool bVar1;
  size_t sVar2;
  uint *puVar3;
  DawgNode *pDVar4;
  AutoPool<Darts::Details::DawgNode> *in_RDI;
  id_type id;
  size_t in_stack_ffffffffffffffd8;
  DawgNode local_18;
  id_type local_c;
  
  bVar1 = AutoStack<unsigned_int>::empty((AutoStack<unsigned_int> *)0x47af9f);
  if (bVar1) {
    sVar2 = AutoPool<Darts::Details::DawgNode>::size(in_RDI);
    local_c = (id_type)sVar2;
    AutoPool<Darts::Details::DawgNode>::append(in_RDI);
  }
  else {
    puVar3 = AutoStack<unsigned_int>::top((AutoStack<unsigned_int> *)in_RDI);
    local_c = *puVar3;
    DawgNode::DawgNode(&local_18);
    pDVar4 = AutoPool<Darts::Details::DawgNode>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    pDVar4->child_ = local_18.child_;
    pDVar4->sibling_ = local_18.sibling_;
    pDVar4->label_ = local_18.label_;
    pDVar4->is_state_ = local_18.is_state_;
    pDVar4->has_sibling_ = local_18.has_sibling_;
    AutoStack<unsigned_int>::pop((AutoStack<unsigned_int> *)0x47b019);
  }
  return local_c;
}

Assistant:

inline id_type DawgBuilder::append_node() {
  id_type id;
  if (recycle_bin_.empty()) {
    id = static_cast<id_type>(nodes_.size());
    nodes_.append();
  } else {
    id = recycle_bin_.top();
    nodes_[id] = DawgNode();
    recycle_bin_.pop();
  }
  return id;
}